

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O3

void __thiscall coins_tests::ccoins_add::test_method(ccoins_add *this)

{
  long lVar1;
  bool *pbVar2;
  long in_FS_OFFSET;
  undefined1 in_stack_ffffffffffffffc8;
  char local_2e [6];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = 0;
  do {
    pbVar2 = (bool *)0x0;
    CheckAddCoinBase(*(CAmount *)((long)&DAT_00e745f8 + lVar1),-2,300,0xffffffff,'\x03','\0',
                     (bool)in_stack_ffffffffffffffc8);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  local_2e[5] = 1;
  CheckAddCoin<long_const&,long_const&,long_const&,char_const&,char_const&,bool>
            (&ABSENT,&VALUE3,(long *)&NO_ENTRY,"\x01",local_2e + 5,pbVar2);
  lVar1 = 0;
  do {
    CheckAddCoinBase(*(CAmount *)((long)&DAT_00e745f8 + lVar1),-1,300,0,'\x03','\0',
                     (bool)in_stack_ffffffffffffffc8);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  lVar1 = 0;
  do {
    CheckAddCoinBase(*(CAmount *)((long)&DAT_00e745f8 + lVar1),-1,300,0,'\x01','\x01',
                     (bool)in_stack_ffffffffffffffc8);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  lVar1 = 0;
  do {
    CheckAddCoinBase(*(CAmount *)((long)&DAT_00e745f8 + lVar1),-1,300,2,'\x03','\0',
                     (bool)in_stack_ffffffffffffffc8);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  lVar1 = 0;
  do {
    pbVar2 = (bool *)0x1;
    CheckAddCoinBase(*(CAmount *)((long)&DAT_00e745f8 + lVar1),-1,300,2,'\x03','\x01',
                     (bool)in_stack_ffffffffffffffc8);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  local_2e[4] = 0;
  CheckAddCoin<long_const&,long_const&,long_const&,char_const&,char_const&,bool>
            (&SPENT,&VALUE3,(long *)&DIRTY,"\x01",local_2e + 4,pbVar2);
  local_2e[3] = 1;
  CheckAddCoin<long_const&,long_const&,long_const&,char_const&,char_const&,bool>
            (&SPENT,&VALUE3,(long *)&DIRTY,"\x01",local_2e + 3,pbVar2);
  lVar1 = 0;
  do {
    CheckAddCoinBase(*(CAmount *)((long)&DAT_00e745f8 + lVar1),-1,300,3,'\x03','\0',
                     (bool)in_stack_ffffffffffffffc8);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  lVar1 = 0;
  do {
    CheckAddCoinBase(*(CAmount *)((long)&DAT_00e745f8 + lVar1),-1,300,3,'\x03','\x01',
                     (bool)in_stack_ffffffffffffffc8);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  lVar1 = 0;
  do {
    CheckAddCoinBase(*(CAmount *)((long)&DAT_00e745f8 + lVar1),200,-3,0,-1,'\0',
                     (bool)in_stack_ffffffffffffffc8);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  lVar1 = 0;
  do {
    pbVar2 = (bool *)0x1;
    CheckAddCoinBase(*(CAmount *)((long)&DAT_00e745f8 + lVar1),200,300,0,'\x01','\x01',
                     (bool)in_stack_ffffffffffffffc8);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  local_2e[2] = 0;
  CheckAddCoin<long_const&,long_const&,long_const&,char_const&,char_const&,bool>
            (&VALUE2,&FAIL,(long *)&FRESH,&NO_ENTRY,local_2e + 2,pbVar2);
  lVar1 = 0;
  do {
    pbVar2 = (bool *)0x1;
    CheckAddCoinBase(*(CAmount *)((long)&DAT_00e745f8 + lVar1),200,300,2,'\x03','\x01',
                     (bool)in_stack_ffffffffffffffc8);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  local_2e[1] = 0;
  CheckAddCoin<long_const&,long_const&,long_const&,char_const&,char_const&,bool>
            (&VALUE2,&FAIL,(long *)&DIRTY,&NO_ENTRY,local_2e + 1,pbVar2);
  local_2e[0] = '\x01';
  CheckAddCoin<long_const&,long_const&,long_const&,char_const&,char_const&,bool>
            (&VALUE2,&VALUE3,(long *)&DIRTY,"\x01",local_2e,pbVar2);
  lVar1 = 0;
  do {
    CheckAddCoinBase(*(CAmount *)((long)&DAT_00e745f8 + lVar1),200,-3,3,-1,'\0',
                     (bool)in_stack_ffffffffffffffc8);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  lVar1 = 0;
  do {
    CheckAddCoinBase(*(CAmount *)((long)&DAT_00e745f8 + lVar1),200,300,3,'\x03','\x01',
                     (bool)in_stack_ffffffffffffffc8);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(ccoins_add)
{
    /* Check AddCoin behavior, requesting a new coin from a cache view,
     * writing a modification to the coin, and then checking the resulting
     * entry in the cache after the modification. Verify behavior with the
     * AddCoin possible_overwrite argument set to false, and to true.
     *
     *           Cache   Write   Result  Cache        Result       possible_overwrite
     *           Value   Value   Value   Flags        Flags
     */
    CheckAddCoin(ABSENT, VALUE3, VALUE3, NO_ENTRY   , DIRTY|FRESH, false);
    CheckAddCoin(ABSENT, VALUE3, VALUE3, NO_ENTRY   , DIRTY      , true );
    CheckAddCoin(SPENT , VALUE3, VALUE3, 0          , DIRTY|FRESH, false);
    CheckAddCoin(SPENT , VALUE3, VALUE3, 0          , DIRTY      , true );
    CheckAddCoin(SPENT , VALUE3, VALUE3, FRESH      , DIRTY|FRESH, false);
    CheckAddCoin(SPENT , VALUE3, VALUE3, FRESH      , DIRTY|FRESH, true );
    CheckAddCoin(SPENT , VALUE3, VALUE3, DIRTY      , DIRTY      , false);
    CheckAddCoin(SPENT , VALUE3, VALUE3, DIRTY      , DIRTY      , true );
    CheckAddCoin(SPENT , VALUE3, VALUE3, DIRTY|FRESH, DIRTY|FRESH, false);
    CheckAddCoin(SPENT , VALUE3, VALUE3, DIRTY|FRESH, DIRTY|FRESH, true );
    CheckAddCoin(VALUE2, VALUE3, FAIL  , 0          , NO_ENTRY   , false);
    CheckAddCoin(VALUE2, VALUE3, VALUE3, 0          , DIRTY      , true );
    CheckAddCoin(VALUE2, VALUE3, FAIL  , FRESH      , NO_ENTRY   , false);
    CheckAddCoin(VALUE2, VALUE3, VALUE3, FRESH      , DIRTY|FRESH, true );
    CheckAddCoin(VALUE2, VALUE3, FAIL  , DIRTY      , NO_ENTRY   , false);
    CheckAddCoin(VALUE2, VALUE3, VALUE3, DIRTY      , DIRTY      , true );
    CheckAddCoin(VALUE2, VALUE3, FAIL  , DIRTY|FRESH, NO_ENTRY   , false);
    CheckAddCoin(VALUE2, VALUE3, VALUE3, DIRTY|FRESH, DIRTY|FRESH, true );
}